

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status
wal_snapshot_open(filemgr *file,fdb_txn *txn,fdb_kvs_id_t kv_id,fdb_seqnum_t seqnum,
                 _fdb_key_cmp_info *key_cmp_info,snap_handle **shandle)

{
  bool bVar1;
  snap_handle *snap_flush_tag;
  uint64_t uVar2;
  fdb_seqnum_t in_RCX;
  fdb_txn *in_RDX;
  filemgr *in_RSI;
  snap_handle *in_RDI;
  _fdb_key_cmp_info *in_R8;
  undefined8 *in_R9;
  snap_handle *_shandle;
  wal *_wal;
  fdb_kvs_id_t in_stack_000000a0;
  wal *in_stack_000000a8;
  fdb_txn *atomic_val;
  
  atomic_val = in_RDI->snap_txn;
  pthread_spin_lock((pthread_spinlock_t *)&atomic_val[1].isolation);
  snap_flush_tag = _wal_get_latest_snapshot(in_stack_000000a8,in_stack_000000a0);
  if (((snap_flush_tag == (snap_handle *)0x0) ||
      (uVar2 = atomic_get_uint64_t((atomic<unsigned_long> *)atomic_val,
                                   (memory_order)((ulong)snap_flush_tag >> 0x20)), uVar2 == 0)) ||
     ((snap_flush_tag->is_flushed & 1U) != 0)) {
    snap_flush_tag =
         _wal_snapshot_create
                   ((fdb_kvs_id_t)in_R9,(wal_snapid_t)atomic_val,(wal_snapid_t)snap_flush_tag);
    if (snap_flush_tag == (snap_handle *)0x0) {
      pthread_spin_unlock((pthread_spinlock_t *)&atomic_val[1].isolation);
      return FDB_RESULT_ALLOC_FAIL;
    }
    _wal_snapshot_init(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  else {
    bVar1 = _wal_snap_is_immutable((snap_handle *)0x18c649);
    if (bVar1) {
      atomic_incr_uint16_t
                ((atomic<unsigned_short> *)atomic_val,(memory_order)((ulong)snap_flush_tag >> 0x20))
      ;
    }
    else {
      _wal_snapshot_init(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
    }
  }
  pthread_spin_unlock((pthread_spinlock_t *)&atomic_val[1].isolation);
  *in_R9 = snap_flush_tag;
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snapshot_open(struct filemgr *file,
                             fdb_txn *txn,
                             fdb_kvs_id_t kv_id,
                             fdb_seqnum_t seqnum,
                             _fdb_key_cmp_info *key_cmp_info,
                             struct snap_handle **shandle)
{
    struct wal *_wal = file->wal;
    struct snap_handle *_shandle;

    spin_lock(&_wal->lock);
    _shandle = _wal_get_latest_snapshot(_wal, kv_id);
    if (!_shandle || // No item exist in WAL for this KV Store
        !atomic_get_uint64_t(&_shandle->wal_ndocs) || // Empty snapshot
        _shandle->is_flushed) { // Latest snapshot has read-write barrier
        // This can happen when a new snapshot is attempted and WAL was flushed
        // and no mutations after WAL flush - the snapshot exists solely for
        // existing open snapshot iterators
        _shandle = _wal_snapshot_create(kv_id, 0, 0);
        if (!_shandle) { // LCOV_EXCL_START
            spin_unlock(&_wal->lock);
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        // This snapshot is not inserted into global shared tree
        _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
        DBG("%s Persisted snapshot taken at %" _F64 " for kv id %" _F64 "\n",
            file->filename, _shandle->seqnum, kv_id);
    } else { // Take a snapshot of the latest WAL state for this KV Store
        if (_wal_snap_is_immutable(_shandle)) { // existing snapshot still open
            atomic_incr_uint16_t(&_shandle->ref_cnt_kvs); // ..just Clone it
        } else { // make this snapshot of the WAL immutable..
            _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
            DBG("%s Snapshot init %" _F64 " - %" _F64 " taken at %"
                _F64 " for kv id %" _F64 "\n",
                file->filename, _shandle->snap_stop_idx,
                _shandle->snap_tag_idx, _shandle->seqnum, kv_id);
        }
    }
    spin_unlock(&_wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}